

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
camp::EnumAlreadyCreated::EnumAlreadyCreated(EnumAlreadyCreated *this,string *name,string *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"a metaenum named ",name);
  std::operator+(&bStack_98,&local_38,", or bound to the type ");
  std::operator+(&local_78,&bStack_98,type);
  std::operator+(&local_58,&local_78," already exists");
  Error::Error(&this->super_Error,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Error = &PTR__Error_001414c8;
  return;
}

Assistant:

EnumAlreadyCreated::EnumAlreadyCreated(const std::string& name, const std::string& type)
    : Error("a metaenum named " + name + ", or bound to the type " + type + " already exists")
{
}